

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ricecomp.c
# Opt level: O3

int fits_rdecomp_byte(uchar *c,int clen,uchar *array,int nx,int nblock)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char *err_message;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint __c;
  byte *pbVar10;
  
  __c = (uint)*c;
  uVar4 = (uint)c[1];
  pbVar10 = c + 2;
  uVar6 = 0;
  uVar9 = 8;
  do {
    if (nx <= (int)uVar6) {
      iVar2 = 0;
      if (c + clen <= pbVar10) {
        return 0;
      }
      err_message = "decompression warning: unused bytes at end of compressed buffer";
      goto LAB_001b55aa;
    }
    if ((int)uVar9 < 3) {
      uVar8 = uVar9 - 0xb;
      do {
        uVar9 = uVar8;
        bVar3 = *pbVar10;
        pbVar10 = pbVar10 + 1;
        uVar4 = (uint)bVar3 | uVar4 << 8;
        uVar8 = uVar9 + 8;
      } while (uVar8 < 0xfffffff8);
      uVar9 = uVar9 + 0x10;
    }
    else {
      uVar9 = uVar9 - 3;
    }
    bVar3 = (byte)uVar9;
    uVar1 = uVar4 >> (bVar3 & 0x1f);
    uVar5 = ~(-1 << (bVar3 & 0x1f));
    uVar4 = uVar4 & uVar5;
    uVar8 = uVar6 + nblock;
    if (nx <= (int)(uVar6 + nblock)) {
      uVar8 = nx;
    }
    iVar2 = uVar1 - 1;
    if (iVar2 < 0) {
      if ((int)uVar6 < (int)uVar8) {
        memset(array + (int)uVar6,__c,(ulong)(~uVar6 + uVar8) + 1);
        uVar6 = uVar8;
      }
    }
    else if (iVar2 == 6) {
      if ((int)uVar6 < (int)uVar8) {
        lVar7 = 0;
        do {
          uVar1 = uVar4 << (8 - bVar3 & 0x1f);
          uVar4 = pbVar10[lVar7] & uVar5;
          if (uVar9 == 0) {
            uVar4 = 0;
          }
          uVar1 = pbVar10[lVar7] >> (bVar3 & 0x1f) | uVar1;
          __c = __c + (-(uVar1 & 1) ^ uVar1 >> 1);
          array[lVar7 + (int)uVar6] = (uchar)__c;
          lVar7 = lVar7 + 1;
        } while ((long)(int)uVar8 - (long)(int)uVar6 != lVar7);
        pbVar10 = pbVar10 + lVar7;
        uVar6 = uVar8;
      }
    }
    else if ((int)uVar6 < (int)uVar8) {
      lVar7 = (long)(int)uVar6;
      do {
        while (uVar4 == 0) {
          uVar9 = uVar9 + 8;
          bVar3 = *pbVar10;
          pbVar10 = pbVar10 + 1;
          uVar4 = (uint)bVar3;
        }
        uVar6 = uVar9 - nonzero_count[uVar4];
        uVar9 = uVar9 + ~uVar6;
        uVar4 = uVar4 ^ 1 << (uVar9 & 0x1f);
        uVar9 = uVar9 - iVar2;
        if ((int)uVar9 < 0) {
          do {
            bVar3 = *pbVar10;
            pbVar10 = pbVar10 + 1;
            uVar4 = uVar4 << 8 | (uint)bVar3;
            uVar9 = uVar9 + 8;
          } while (7 < uVar9);
        }
        uVar6 = uVar4 >> ((byte)uVar9 & 0x1f) | uVar6 << ((byte)iVar2 & 0x1f);
        uVar4 = ~(-1 << ((byte)uVar9 & 0x1f)) & uVar4;
        __c = __c + (-(uVar6 & 1) ^ uVar6 >> 1);
        array[lVar7] = (uchar)__c;
        lVar7 = lVar7 + 1;
        uVar6 = uVar8;
      } while (lVar7 != (int)uVar8);
    }
  } while (pbVar10 <= c + clen);
  iVar2 = 1;
  err_message = "decompression error: hit end of compressed byte stream";
LAB_001b55aa:
  ffpmsg(err_message);
  return iVar2;
}

Assistant:

int fits_rdecomp_byte (unsigned char *c,		/* input buffer			*/
	     int clen,			/* length of input		*/
	     unsigned char array[],  	/* output array			*/
	     int nx,			/* number of output pixels	*/
	     int nblock)		/* coding block size		*/
{
int i, imax;
/* int bsize; */
int k;
int nbits, nzero, fs;
unsigned char *cend;
unsigned int b, diff, lastpix;
int fsmax, fsbits, bbits;
extern const int nonzero_count[];

   /*
     * Original size of each pixel (bsize, bytes) and coding block
     * size (nblock, pixels)
     * Could make bsize a parameter to allow more efficient
     * compression of short & byte images.
     */

/*    bsize = 1; */
    
/*    nblock = 32; now an input parameter */
    /*
     * From bsize derive:
     * FSBITS = # bits required to store FS
     * FSMAX = maximum value for FS
     * BBITS = bits/pixel for direct coding
     */

/*
    switch (bsize) {
    case 1:
	fsbits = 3;
	fsmax = 6;
	break;
    case 2:
	fsbits = 4;
	fsmax = 14;
	break;
    case 4:
	fsbits = 5;
	fsmax = 25;
	break;
    default:
        ffpmsg("rdecomp: bsize must be 1, 2, or 4 bytes");
	return 1;
    }
*/

    /* move out of switch block, to tweak performance */
    fsbits = 3;
    fsmax = 6;

    bbits = 1<<fsbits;

    /*
     * Decode in blocks of nblock pixels
     */

    /* first byte of input buffer contain the value of the first */
    /* byte integer value, without any encoding */
    
    lastpix = c[0];
    c += 1;  
    cend = c + clen - 1;

    b = *c++;		    /* bit buffer			*/
    nbits = 8;		    /* number of bits remaining in b	*/
    for (i = 0; i<nx; ) {
	/* get the FS value from first fsbits */
	nbits -= fsbits;
	while (nbits < 0) {
	    b = (b<<8) | (*c++);
	    nbits += 8;
	}
	fs = (b >> nbits) - 1;

	b &= (1<<nbits)-1;
	/* loop over the next block */
	imax = i + nblock;
	if (imax > nx) imax = nx;
	if (fs<0) {
	    /* low-entropy case, all zero differences */
	    for ( ; i<imax; i++) array[i] = lastpix;
	} else if (fs==fsmax) {
	    /* high-entropy case, directly coded pixel values */
	    for ( ; i<imax; i++) {
		k = bbits - nbits;
		diff = b<<k;
		for (k -= 8; k >= 0; k -= 8) {
		    b = *c++;
		    diff |= b<<k;
		}
		if (nbits>0) {
		    b = *c++;
		    diff |= b>>(-k);
		    b &= (1<<nbits)-1;
		} else {
		    b = 0;
		}
   
		/*
		 * undo mapping and differencing
		 * Note that some of these operations will overflow the
		 * unsigned int arithmetic -- that's OK, it all works
		 * out to give the right answers in the output file.
		 */
		if ((diff & 1) == 0) {
		    diff = diff>>1;
		} else {
		    diff = ~(diff>>1);
		}
		array[i] = diff+lastpix;
		lastpix = array[i];
	    }
	} else {
	    /* normal case, Rice coding */
	    for ( ; i<imax; i++) {
		/* count number of leading zeros */
		while (b == 0) {
		    nbits += 8;
		    b = *c++;
		}
		nzero = nbits - nonzero_count[b];
		nbits -= nzero+1;
		/* flip the leading one-bit */
		b ^= 1<<nbits;
		/* get the FS trailing bits */
		nbits -= fs;
		while (nbits < 0) {
		    b = (b<<8) | (*c++);
		    nbits += 8;
		}
		diff = (nzero<<fs) | (b>>nbits);
		b &= (1<<nbits)-1;

		/* undo mapping and differencing */
		if ((diff & 1) == 0) {
		    diff = diff>>1;
		} else {
		    diff = ~(diff>>1);
		}
		array[i] = diff+lastpix;
		lastpix = array[i];
	    }
	}
	if (c > cend) {
            ffpmsg("decompression error: hit end of compressed byte stream");
	    return 1;
	}
    }
    if (c < cend) {
        ffpmsg("decompression warning: unused bytes at end of compressed buffer");
    }
    return 0;
}